

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  
  if (p->fGiaSimple == 0) {
    uVar5 = *(ulong *)pObj;
    if (((-1 < (int)(uint)uVar5) && (uVar6 = (uint)uVar5 & 0x1fffffff, uVar6 != 0x1fffffff)) &&
       (uVar6 == ((uint)(uVar5 >> 0x20) & 0x1fffffff))) {
      if ((uVar5 & 0x1fffffff) == 0x1fffffff) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x240,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar4 = pObj + -(uVar5 & 0x1fffffff);
      pGVar8 = p->pObjs;
      if ((pGVar4 < pGVar8) || (pGVar8 + p->nObjs <= pGVar4)) goto LAB_00702931;
      uVar6 = (int)((long)pGVar4 - (long)pGVar8 >> 2) * -0x55555555;
      pVVar9 = p->vLevels;
      Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
      if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
      pGVar4 = p->pObjs;
      if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_00702931;
      iVar7 = pVVar9->pArray[uVar6 & 0x7fffffff];
      uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      pVVar9 = p->vLevels;
      Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
      if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_0070296f;
      goto LAB_00702915;
    }
  }
  pGVar4 = p->pObjs;
  if ((pObj < pGVar4) || (pGVar8 = pGVar4 + p->nObjs, pGVar8 <= pObj)) {
LAB_00702931:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((p->pMuxes == (uint *)0x0) ||
     (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555] == 0)) {
    uVar5 = *(ulong *)pObj;
    if ((uVar5 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar5 < 0) {
      return;
    }
    pGVar1 = pObj + -(uVar5 & 0x1fffffff);
    if (((uint)(uVar5 >> 0x20) & 0x1fffffff) <= ((uint)uVar5 & 0x1fffffff)) {
      if (pGVar8 <= pGVar1 || pGVar1 < pGVar4) goto LAB_00702931;
      uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
      pVVar9 = p->vLevels;
      Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
      if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
      pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar8 = p->pObjs;
      if ((pGVar4 < pGVar8) || (pGVar8 + p->nObjs <= pGVar4)) goto LAB_00702931;
      iVar2 = pVVar9->pArray[uVar6 & 0x7fffffff];
      uVar6 = (int)((long)pGVar4 - (long)pGVar8 >> 2) * -0x55555555;
      pVVar9 = p->vLevels;
      Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
      if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
      pGVar4 = p->pObjs;
      if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_00702931;
      iVar7 = pVVar9->pArray[uVar6 & 0x7fffffff];
      uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      pVVar9 = p->vLevels;
      Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
      if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_0070296f;
      if (iVar7 < iVar2) {
        iVar7 = iVar2;
      }
      iVar7 = iVar7 + 1;
      goto LAB_00702915;
    }
    if (pGVar8 <= pGVar1 || pGVar1 < pGVar4) goto LAB_00702931;
    uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
    pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    pGVar8 = p->pObjs;
    if ((pGVar4 < pGVar8) || (pGVar8 + p->nObjs <= pGVar4)) goto LAB_00702931;
    iVar2 = pVVar9->pArray[uVar6 & 0x7fffffff];
    uVar6 = (int)((long)pGVar4 - (long)pGVar8 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
    pGVar4 = p->pObjs;
    if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_00702931;
    iVar7 = pVVar9->pArray[uVar6 & 0x7fffffff];
    uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) {
LAB_0070296f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    if (iVar7 < iVar2) {
      iVar7 = iVar2;
    }
  }
  else {
    pGVar1 = pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
    if ((pGVar1 < pGVar4) || (pGVar8 <= pGVar1)) goto LAB_00702931;
    uVar6 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) {
LAB_00702950:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pGVar4 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    pGVar8 = p->pObjs;
    if ((pGVar4 < pGVar8) || (pGVar8 + p->nObjs <= pGVar4)) goto LAB_00702931;
    iVar2 = pVVar9->pArray[uVar6 & 0x7fffffff];
    uVar6 = (int)((long)pGVar4 - (long)pGVar8 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
    iVar7 = pVVar9->pArray[uVar6 & 0x7fffffff];
    pGVar4 = p->pObjs;
    if (p->pMuxes == (uint *)0x0) {
      pGVar8 = (Gia_Obj_t *)0x0;
    }
    else {
      if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_00702931;
      uVar6 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555];
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar6 = uVar6 >> 1;
      if (p->nObjs <= (int)uVar6) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar8 = pGVar4 + uVar6;
    }
    if ((pGVar8 < pGVar4) || (pGVar4 + p->nObjs <= pGVar8)) goto LAB_00702931;
    uVar6 = (int)((long)pGVar8 - (long)pGVar4 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_00702950;
    pGVar4 = p->pObjs;
    if ((pObj < pGVar4) || (pGVar4 + p->nObjs <= pObj)) goto LAB_00702931;
    iVar3 = pVVar9->pArray[uVar6 & 0x7fffffff];
    uVar6 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar6 + 1,0);
    if (((int)uVar6 < 0) || (pVVar9->nSize <= (int)uVar6)) goto LAB_0070296f;
    if (iVar7 < iVar2) {
      iVar7 = iVar2;
    }
    if (iVar7 <= iVar3) {
      iVar7 = iVar3;
    }
  }
  iVar7 = iVar7 + 2;
LAB_00702915:
  pVVar9->pArray[uVar6 & 0x7fffffff] = iVar7;
  return;
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }